

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakHash.c
# Opt level: O2

HashReturn
Keccak_HashInitialize
          (Keccak_HashInstance *instance,uint rate,uint capacity,uint hashbitlen,
          uchar delimitedSuffix)

{
  HashReturn HVar1;
  undefined3 in_register_00000081;
  
  if (CONCAT31(in_register_00000081,delimitedSuffix) != 0) {
    HVar1 = KeccakWidth1600_SpongeInitialize(&instance->sponge,rate,capacity);
    if (HVar1 == SUCCESS) {
      instance->fixedOutputLength = hashbitlen;
      instance->delimitedSuffix = delimitedSuffix;
      HVar1 = SUCCESS;
    }
    return HVar1;
  }
  return FAIL;
}

Assistant:

HashReturn Keccak_HashInitialize(Keccak_HashInstance *instance,
                                 unsigned int rate, unsigned int capacity,
                                 unsigned int hashbitlen,
                                 unsigned char delimitedSuffix) {
  HashReturn result;

  if (delimitedSuffix == 0) return FAIL;
  result = (HashReturn)KeccakWidth1600_SpongeInitialize(&instance->sponge, rate,
                                                        capacity);
  if (result != SUCCESS) return result;
  instance->fixedOutputLength = hashbitlen;
  instance->delimitedSuffix = delimitedSuffix;
  return SUCCESS;
}